

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta_abstract.c
# Opt level: O3

TA_RetCode TA_ForEachFunc(TA_CallForEachFunc functionToCall,void *opaqueData)

{
  uint uVar1;
  TA_FuncDef **ppTVar2;
  TA_FuncInfo *pTVar3;
  ulong uVar4;
  long lVar5;
  
  if (functionToCall == (TA_CallForEachFunc)0x0) {
    return TA_BAD_PARAM;
  }
  lVar5 = 0;
  do {
    uVar1 = *TA_DEF_TablesSize[lVar5];
    if ((ulong)uVar1 != 0) {
      ppTVar2 = TA_DEF_Tables[lVar5];
      uVar4 = 0;
      do {
        if (ppTVar2[uVar4] == (TA_FuncDef *)0x0) {
          return TA_INTERNAL_ERROR|TA_ALLOC_ERR;
        }
        pTVar3 = ppTVar2[uVar4]->funcInfo;
        if (pTVar3 == (TA_FuncInfo *)0x0) {
          return TA_INTERNAL_ERROR|TA_ALLOC_ERR;
        }
        (*functionToCall)(pTVar3,opaqueData);
        uVar4 = uVar4 + 1;
      } while (uVar1 != uVar4);
    }
    lVar5 = lVar5 + 1;
    if (lVar5 == 0x1a) {
      return TA_SUCCESS;
    }
  } while( true );
}

Assistant:

TA_RetCode TA_ForEachFunc( TA_CallForEachFunc functionToCall, void *opaqueData )
{
   const TA_FuncDef **funcDefTable;
   const TA_FuncDef *funcDef;
   const TA_FuncInfo *funcInfo;
   unsigned int i, j, funcDefTableSize;

   if( functionToCall == NULL )
   {
      return TA_BAD_PARAM;
   }
   
   /* Iterate the tables (each table is for one letter) */
   for( i=0; i < 26; i++ )
   {   
      funcDefTable = TA_DEF_Tables[i];

      /* Identify the table size. */
      funcDefTableSize = *TA_DEF_TablesSize[i];
      for( j=0; j < funcDefTableSize; j++ )
      {
         funcDef = funcDefTable[j];
         if( !funcDef || !funcDef->funcInfo )
            return TA_INTERNAL_ERROR(3);

         funcInfo = funcDef->funcInfo;      
         if( !funcInfo )
            return TA_INTERNAL_ERROR(4);	
         (*functionToCall)( funcInfo, opaqueData );
      }
   }

   return TA_SUCCESS;
}